

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_334836::sessionT11Fixture::createSession
          (sessionT11Fixture *this,int heartBtInt,int startDay,int endDay)

{
  Session *pSVar1;
  allocator<char> local_72c;
  allocator<char> local_72b;
  allocator<char> local_72a;
  allocator<char> local_729;
  STRING local_728;
  STRING local_708;
  FieldBase local_6e8;
  FieldBase local_690;
  string local_638;
  _Any_data local_618;
  code *local_608;
  code *local_600;
  TimeRange sessionTime;
  SessionID sessionID;
  DataDictionaryProvider provider;
  
  if (this->object != (Session *)0x0) {
    (**(code **)(*(long *)this->object + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&sessionTime,"FIXT.1.1",&local_72c);
  FIX::BeginString::BeginString((BeginString *)&provider,(STRING *)&sessionTime);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"TW",&local_729);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_690,&local_728);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"ISLD",&local_72a);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_6e8,&local_708);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"",&local_72b);
  FIX::SessionID::SessionID
            (&sessionID,
             (string *)
             &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent,&local_690.m_string,&local_6e8.m_string,&local_638);
  std::__cxx11::string::~string((string *)&local_638);
  FIX::FieldBase::~FieldBase(&local_6e8);
  std::__cxx11::string::~string((string *)&local_708);
  FIX::FieldBase::~FieldBase(&local_690);
  std::__cxx11::string::~string((string *)&local_728);
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  std::__cxx11::string::~string((string *)&sessionTime);
  FIX::TimeRange::TimeRange
            (&sessionTime,&(this->super_TestCallback).startTime,&(this->super_TestCallback).endTime,
             startDay,endDay);
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"FIXT11",(allocator<char> *)&local_728);
  FIX::TestSettings::pathForSpec((string *)&local_690,(string *)&local_6e8);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"7",(allocator<char> *)&local_638);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_690,(STRING *)&local_6e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"FIX50",&local_72c);
  FIX::TestSettings::pathForSpec(&local_728,&local_708);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)&local_690,&local_728);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  FIX::FieldBase::~FieldBase(&local_690);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"4",(allocator<char> *)&local_638);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_690,(STRING *)&local_6e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"FIX42",&local_72c);
  FIX::TestSettings::pathForSpec(&local_728,&local_708);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)&local_690,&local_728);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  FIX::FieldBase::~FieldBase(&local_690);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"2",(allocator<char> *)&local_638);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_690,(STRING *)&local_6e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"FIX40",&local_72c);
  FIX::TestSettings::pathForSpec(&local_728,&local_708);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)&local_690,&local_728);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  FIX::FieldBase::~FieldBase(&local_690);
  std::__cxx11::string::~string((string *)&local_6e8);
  pSVar1 = (Session *)operator_new(0x878);
  local_618._8_8_ = 0;
  local_600 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:546:26)>
              ::_M_invoke;
  local_608 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:546:26)>
              ::_M_manager;
  local_618._M_unused._M_object = this;
  FIX::Session::Session
            (pSVar1,&local_618,&(this->super_TestCallback).super_NullApplication,&this->factory,
             &sessionID,&provider,&sessionTime,heartBtInt,0);
  this->object = pSVar1;
  std::_Function_base::~_Function_base((_Function_base *)&local_618);
  pSVar1 = this->object;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"FIX.5.0",(allocator<char> *)&local_708);
  FIX::BeginString::BeginString((BeginString *)&local_6e8,&local_728);
  FIX::Message::toApplVerID((ApplVerID *)&local_690,(BeginString *)&local_6e8);
  std::__cxx11::string::_M_assign((string *)(pSVar1 + 0x200));
  FIX::FieldBase::~FieldBase(&local_690);
  FIX::FieldBase::~FieldBase(&local_6e8);
  std::__cxx11::string::~string((string *)&local_728);
  FIX::Session::setResponder(this->object,(Responder *)this);
  FIX::DataDictionaryProvider::~DataDictionaryProvider(&provider);
  FIX::SessionID::~SessionID(&sessionID);
  return;
}

Assistant:

virtual void createSession(int heartBtInt, int startDay = -1, int endDay = -1) {
    if (object) {
      delete object;
    }

    SessionID sessionID(BeginString("FIXT.1.1"), SenderCompID("TW"), TargetCompID("ISLD"));
    TimeRange sessionTime(startTime, endTime, startDay, endDay);

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary(sessionID.getBeginString(), FIX::TestSettings::pathForSpec("FIXT11"));
    provider.addApplicationDataDictionary(ApplVerID(ApplVerID_FIX50), FIX::TestSettings::pathForSpec("FIX50"));
    provider.addApplicationDataDictionary(ApplVerID(ApplVerID_FIX42), FIX::TestSettings::pathForSpec("FIX42"));
    provider.addApplicationDataDictionary(ApplVerID(ApplVerID_FIX40), FIX::TestSettings::pathForSpec("FIX40"));

    object = new Session([this]() { return now; }, *this, factory, sessionID, provider, sessionTime, heartBtInt, 0);
    object->setSenderDefaultApplVerID(FIX::Message::toApplVerID(BeginString("FIX.5.0")));
    object->setResponder(this);
  }